

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.h
# Opt level: O2

Value * __thiscall
soul::Value::castToTypeWithError<soul::CodeLocation&>
          (Value *__return_storage_ptr__,Value *this,Type *destType,CodeLocation *errorLocation)

{
  CompileMessage errorMessage;
  CompileMessage local_80;
  CompileMessage local_48;
  
  local_80.description._M_dataplus._M_p = (pointer)&local_80.description.field_2;
  local_80.description._M_string_length = 0;
  local_80.description.field_2._M_local_buf[0] = '\0';
  local_80.location.sourceCode.object = (SourceCodeText *)0x0;
  local_80.location.location.data = (char *)0x0;
  local_80.type = error;
  local_80.category = none;
  tryCastToType(__return_storage_ptr__,this,destType,&local_80);
  if ((__return_storage_ptr__->type).category != invalid) {
    CompileMessage::~CompileMessage(&local_80);
    return __return_storage_ptr__;
  }
  CompileMessage::CompileMessage(&local_48,&local_80);
  CodeLocation::throwError(errorLocation,&local_48);
}

Assistant:

Value castToTypeWithError (const Type& destType, Thrower&& errorLocation) const
    {
        CompileMessage errorMessage;
        auto result = tryCastToType (destType, errorMessage);

        if (! result.isValid())
            errorLocation.throwError (errorMessage);

        return result;
    }